

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void doemit(parse *p,sop op,sop opnd)

{
  long lVar1;
  sop opnd_local;
  sop op_local;
  parse *p_local;
  
  if (p->error == 0) {
    if (0x3ffffff < opnd) {
      __assert_fail("opnd < 1<<OPSHIFT",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x5d7,"void doemit()");
    }
    if (p->ssize <= p->slen) {
      enlarge(p,((p->ssize + 1) / 2) * 3);
    }
    if (p->ssize <= p->slen) {
      __assert_fail("p->slen < p->ssize",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x5dc,"void doemit()");
    }
    lVar1 = p->slen;
    p->slen = lVar1 + 1;
    p->strip[lVar1] = op | opnd;
  }
  return;
}

Assistant:

static void
doemit(p, op, opnd)
struct parse *p;
sop op;
sop opnd;
{
	/* avoid making error situations worse */
	if (p->error != 0)
		return;

	/* deal with oversize operands ("can't happen", more or less) */
	assert(opnd < 1<<OPSHIFT);

	/* deal with undersized strip */
	if (p->slen >= p->ssize)
		enlarge(p, (p->ssize+1) / 2 * 3);	/* +50% */
	assert(p->slen < p->ssize);

	/* finally, it's all reduced to the easy case */
	p->strip[p->slen++] = SOP(op, opnd);
}